

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

size_t qHash(QUrl *url,size_t seed)

{
  QUrlPrivate *pQVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  
  pQVar1 = url->d;
  if (pQVar1 != (QUrlPrivate *)0x0) {
    sVar2 = qHash(&pQVar1->scheme,0);
    sVar3 = qHash(&pQVar1->userName,0);
    sVar4 = qHash(&pQVar1->password,0);
    sVar5 = qHash(&pQVar1->host,0);
    sVar6 = qHash(pQVar1->port,seed);
    sVar7 = qHash(&pQVar1->path,0);
    sVar8 = qHash(&pQVar1->query,0);
    sVar9 = qHash(&pQVar1->fragment,0);
    return sVar9 ^ sVar8 ^ sVar7 ^ sVar5 ^ sVar4 ^ sVar3 ^ sVar2 ^ sVar6;
  }
  sVar2 = QHashPrivate::hash(0xffffffffffffffff,seed);
  return sVar2;
}

Assistant:

size_t qHash(const QUrl &url, size_t seed) noexcept
{
    if (!url.d)
        return qHash(-1, seed); // the hash of an unset port (-1)

    return qHash(url.d->scheme) ^
            qHash(url.d->userName) ^
            qHash(url.d->password) ^
            qHash(url.d->host) ^
            qHash(url.d->port, seed) ^
            qHash(url.d->path) ^
            qHash(url.d->query) ^
            qHash(url.d->fragment);
}